

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

void gzclearerr(gzFile file)

{
  gz_statep state;
  gzFile file_local;
  
  if ((file != (gzFile)0x0) && ((file[1].have == 0x1c4f || (file[1].have == 0x79b1)))) {
    if (file[1].have == 0x1c4f) {
      *(undefined4 *)&file[3].next = 0;
      *(undefined4 *)((long)&file[3].next + 4) = 0;
    }
    gz_error((gz_statep)file,0,(char *)0x0);
  }
  return;
}

Assistant:

void ZEXPORT gzclearerr(gzFile file) {
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return;

    /* clear error and end-of-file */
    if (state->mode == GZ_READ) {
        state->eof = 0;
        state->past = 0;
    }
    gz_error(state, Z_OK, NULL);
}